

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsaz_exp.c
# Opt level: O0

void RSAZ_512_mod_exp(unsigned_long *result,unsigned_long *base,unsigned_long *exponent,
                     unsigned_long *m,unsigned_long k0,unsigned_long *RR)

{
  byte bVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  long *plVar4;
  long *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  uint wvalue;
  int index;
  uchar *p_str;
  unsigned_long *temp;
  unsigned_long *a_inv;
  uchar *table;
  uchar storage [1216];
  int local_51c;
  undefined1 local_4f8 [64];
  undefined1 auStack_4b8 [1024];
  undefined1 auStack_b8 [64];
  long alStack_78 [11];
  long *local_20;
  undefined8 local_10;
  undefined8 local_8;
  
  puVar2 = auStack_4b8 + -((ulong)local_4f8 & 0x3f);
  puVar3 = puVar2 + 0x400;
  plVar4 = (long *)(puVar2 + 0x440);
  *plVar4 = -*in_RCX;
  *(ulong *)(puVar2 + 0x448) = in_RCX[1] ^ 0xffffffffffffffff;
  *(ulong *)(puVar2 + 0x450) = in_RCX[2] ^ 0xffffffffffffffff;
  *(ulong *)(puVar2 + 0x458) = in_RCX[3] ^ 0xffffffffffffffff;
  *(ulong *)(puVar2 + 0x460) = in_RCX[4] ^ 0xffffffffffffffff;
  *(ulong *)(puVar2 + 0x468) = in_RCX[5] ^ 0xffffffffffffffff;
  *(ulong *)(puVar2 + 0x470) = in_RCX[6] ^ 0xffffffffffffffff;
  *(ulong *)(puVar2 + 0x478) = in_RCX[7] ^ 0xffffffffffffffff;
  alStack_78[9] = in_R9;
  alStack_78[10] = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  rsaz_512_scatter4(puVar2,plVar4,0);
  rsaz_512_mul(puVar3,local_10,alStack_78[9],local_20,alStack_78[10]);
  rsaz_512_scatter4(puVar2,puVar3,1);
  rsaz_512_sqr(plVar4,puVar3,local_20,alStack_78[10],1);
  rsaz_512_scatter4(puVar2,plVar4,2);
  for (local_51c = 3; local_51c < 0x10; local_51c = local_51c + 1) {
    rsaz_512_mul_scatter4(plVar4,puVar3,local_20,alStack_78[10],puVar2,local_51c);
  }
  bVar1 = *(byte *)(in_RDX + 0x3f);
  rsaz_512_gather4(plVar4,puVar2,bVar1 >> 4);
  rsaz_512_sqr(plVar4,plVar4,local_20,alStack_78[10],4);
  rsaz_512_mul_gather4(plVar4,plVar4,puVar2,local_20,alStack_78[10],bVar1 & 0xf);
  for (local_51c = 0x3e; -1 < local_51c; local_51c = local_51c + -1) {
    bVar1 = *(byte *)(in_RDX + local_51c);
    rsaz_512_sqr(plVar4,plVar4,local_20,alStack_78[10],4);
    rsaz_512_mul_gather4(plVar4,plVar4,puVar2,local_20,alStack_78[10],bVar1 >> 4);
    rsaz_512_sqr(plVar4,plVar4,local_20,alStack_78[10],4);
    rsaz_512_mul_gather4(plVar4,plVar4,puVar2,local_20,alStack_78[10],bVar1 & 0xf);
  }
  rsaz_512_mul_by_one(local_8,plVar4,local_20,alStack_78[10]);
  OPENSSL_cleanse(local_4f8,0x4c0);
  return;
}

Assistant:

void RSAZ_512_mod_exp(BN_ULONG result[8],
                      const BN_ULONG base[8], const BN_ULONG exponent[8],
                      const BN_ULONG m[8], BN_ULONG k0, const BN_ULONG RR[8])
{
    unsigned char storage[16 * 8 * 8 + 64 * 2 + 64]; /* 1.2KB */
    unsigned char *table = storage + (64 - ((size_t)storage % 64));
    BN_ULONG *a_inv = (BN_ULONG *)(table + 16 * 8 * 8);
    BN_ULONG *temp = (BN_ULONG *)(table + 16 * 8 * 8 + 8 * 8);
    unsigned char *p_str = (unsigned char *)exponent;
    int index;
    unsigned int wvalue;

    /* table[0] = 1_inv */
    temp[0] = 0 - m[0];
    temp[1] = ~m[1];
    temp[2] = ~m[2];
    temp[3] = ~m[3];
    temp[4] = ~m[4];
    temp[5] = ~m[5];
    temp[6] = ~m[6];
    temp[7] = ~m[7];
    rsaz_512_scatter4(table, temp, 0);

    /* table [1] = a_inv^1 */
    rsaz_512_mul(a_inv, base, RR, m, k0);
    rsaz_512_scatter4(table, a_inv, 1);

    /* table [2] = a_inv^2 */
    rsaz_512_sqr(temp, a_inv, m, k0, 1);
    rsaz_512_scatter4(table, temp, 2);

    for (index = 3; index < 16; index++)
        rsaz_512_mul_scatter4(temp, a_inv, m, k0, table, index);

    /* load first window */
    wvalue = p_str[63];

    rsaz_512_gather4(temp, table, wvalue >> 4);
    rsaz_512_sqr(temp, temp, m, k0, 4);
    rsaz_512_mul_gather4(temp, temp, table, m, k0, wvalue & 0xf);

    for (index = 62; index >= 0; index--) {
        wvalue = p_str[index];

        rsaz_512_sqr(temp, temp, m, k0, 4);
        rsaz_512_mul_gather4(temp, temp, table, m, k0, wvalue >> 4);

        rsaz_512_sqr(temp, temp, m, k0, 4);
        rsaz_512_mul_gather4(temp, temp, table, m, k0, wvalue & 0x0f);
    }

    /* from Montgomery */
    rsaz_512_mul_by_one(result, temp, m, k0);

    OPENSSL_cleanse(storage, sizeof(storage));
}